

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt__buf stbtt__get_subrs(stbtt__buf cff,stbtt__buf fontdict)

{
  stbtt__buf sVar1;
  stbtt__buf pdict;
  stbtt_uint32 private_loc [2];
  stbtt_uint32 subrsoff;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  stbtt__buf *in_stack_ffffffffffffffa0;
  stbtt_uint32 *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_38;
  stbtt__buf local_10;
  
  memset(&stack0xffffffffffffffc4,0,8);
  stbtt__dict_get_ints
            ((stbtt__buf *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0);
  if ((local_38 == 0) || (in_stack_ffffffffffffffc4 == 0)) {
    local_10 = stbtt__new_buf((void *)0x0,0);
  }
  else {
    sVar1 = stbtt__buf_range(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                             in_stack_ffffffffffffff98);
    stbtt__dict_get_ints
              ((stbtt__buf *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               sVar1.size,sVar1.cursor,(stbtt_uint32 *)sVar1.data);
    local_10 = stbtt__new_buf((void *)0x0,0);
  }
  return local_10;
}

Assistant:

static stbtt__buf stbtt__get_subrs(stbtt__buf cff, stbtt__buf fontdict)
{
   stbtt_uint32 subrsoff = 0, private_loc[2] = { 0, 0 };
   stbtt__buf pdict;
   stbtt__dict_get_ints(&fontdict, 18, 2, private_loc);
   if (!private_loc[1] || !private_loc[0]) return stbtt__new_buf(NULL, 0);
   pdict = stbtt__buf_range(&cff, private_loc[1], private_loc[0]);
   stbtt__dict_get_ints(&pdict, 19, 1, &subrsoff);
   if (!subrsoff) return stbtt__new_buf(NULL, 0);
   stbtt__buf_seek(&cff, private_loc[1]+subrsoff);
   return stbtt__cff_get_index(&cff);
}